

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O3

int CBB_init(CBB *cbb,size_t initial_capacity)

{
  uint8_t *puVar1;
  
  (cbb->u).base.cap = 0;
  *(undefined8 *)((long)&cbb->u + 0x18) = 0;
  (cbb->u).base.buf = (uint8_t *)0x0;
  (cbb->u).base.len = 0;
  cbb->child = (CBB *)0x0;
  *(undefined8 *)&cbb->is_child = 0;
  puVar1 = (uint8_t *)OPENSSL_malloc(initial_capacity);
  if (initial_capacity == 0 || puVar1 != (uint8_t *)0x0) {
    cbb->is_child = '\0';
    cbb->child = (CBB *)0x0;
    (cbb->u).base.buf = puVar1;
    (cbb->u).base.len = 0;
    (cbb->u).base.cap = initial_capacity;
    *(byte *)((long)&cbb->u + 0x18) = (*(byte *)((long)&cbb->u + 0x18) & 0xfc) + 1;
  }
  return (uint)(initial_capacity == 0 || puVar1 != (uint8_t *)0x0);
}

Assistant:

int CBB_init(CBB *cbb, size_t initial_capacity) {
  CBB_zero(cbb);

  uint8_t *buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(initial_capacity));
  if (initial_capacity > 0 && buf == NULL) {
    return 0;
  }

  cbb_init(cbb, buf, initial_capacity, /*can_resize=*/1);
  return 1;
}